

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

void __thiscall mocker::ir::Builder::operator()(Builder *this,BoolLitExpr *node)

{
  bool bVar1;
  BuilderContext *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<mocker::ir::Addr> local_38;
  BoolLitExpr *local_28;
  
  this_00 = this->ctx;
  bVar1 = node->val;
  local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f0ce8;
  local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0d38;
  local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = (int)(ulong)bVar1;
  local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = (int)((ulong)bVar1 >> 0x20);
  BuilderContext::setExprAddr(this_00,(NodeID)node,&local_38);
  if (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_28 = node;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_emplace<unsigned_long>(&(this->ctx->trivialExpr)._M_h);
  BuilderContext::checkLogicalExpr(this->ctx,(Expression *)node);
  return;
}

Assistant:

void Builder::operator()(const ast::BoolLitExpr &node) const {
  ctx.setExprAddr(node.getID(),
                  std::make_shared<IntLiteral>((Integer)node.val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}